

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# psa_crypto.c
# Opt level: O0

psa_status_t psa_mac_finish_internal(psa_mac_operation_t *operation,uint8_t *mac,size_t mac_size)

{
  int ret_00;
  uchar local_38 [4];
  int ret;
  uint8_t tmp [16];
  size_t mac_size_local;
  uint8_t *mac_local;
  psa_mac_operation_t *operation_local;
  
  if ((operation->field_0x4 & 1) == 0) {
    operation_local._4_4_ = -0x89;
  }
  else if ((((byte)operation->field_0x4 >> 1 & 1) == 0) ||
          (((byte)operation->field_0x4 >> 2 & 1) != 0)) {
    if (mac_size < operation->mac_size) {
      operation_local._4_4_ = -0x8a;
    }
    else {
      tmp._8_8_ = mac_size;
      if (operation->alg == 0x2c00002) {
        ret_00 = mbedtls_cipher_cmac_finish(&(operation->ctx).cmac,local_38);
        if (ret_00 == 0) {
          memcpy(mac,local_38,(ulong)operation->mac_size);
        }
        mbedtls_platform_zeroize(local_38,0x10);
        operation_local._4_4_ = mbedtls_to_psa_error(ret_00);
      }
      else if ((operation->alg & 0x7fc00000) == 0x2800000) {
        operation_local._4_4_ =
             psa_hmac_finish_internal(&(operation->ctx).hmac,mac,(ulong)operation->mac_size);
      }
      else {
        operation_local._4_4_ = -0x89;
      }
    }
  }
  else {
    operation_local._4_4_ = -0x89;
  }
  return operation_local._4_4_;
}

Assistant:

static psa_status_t psa_mac_finish_internal( psa_mac_operation_t *operation,
                                             uint8_t *mac,
                                             size_t mac_size )
{
    if( ! operation->key_set )
        return( PSA_ERROR_BAD_STATE );
    if( operation->iv_required && ! operation->iv_set )
        return( PSA_ERROR_BAD_STATE );

    if( mac_size < operation->mac_size )
        return( PSA_ERROR_BUFFER_TOO_SMALL );

#if defined(MBEDTLS_CMAC_C)
    if( operation->alg == PSA_ALG_CMAC )
    {
        uint8_t tmp[PSA_MAX_BLOCK_CIPHER_BLOCK_SIZE];
        int ret = mbedtls_cipher_cmac_finish( &operation->ctx.cmac, tmp );
        if( ret == 0 )
            memcpy( mac, tmp, operation->mac_size );
        mbedtls_platform_zeroize( tmp, sizeof( tmp ) );
        return( mbedtls_to_psa_error( ret ) );
    }
    else
#endif /* MBEDTLS_CMAC_C */
#if defined(MBEDTLS_MD_C)
    if( PSA_ALG_IS_HMAC( operation->alg ) )
    {
        return( psa_hmac_finish_internal( &operation->ctx.hmac,
                                          mac, operation->mac_size ) );
    }
    else
#endif /* MBEDTLS_MD_C */
    {
        /* This shouldn't happen if `operation` was initialized by
         * a setup function. */
        return( PSA_ERROR_BAD_STATE );
    }
}